

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int mbedtls_x509_crt_verify_with_profile
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_profile *profile,char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy)

{
  int iVar1;
  mbedtls_pk_type_t pk_alg;
  size_t len;
  bool bVar2;
  mbedtls_x509_buf *pmStack_78;
  mbedtls_pk_type_t pk_type;
  mbedtls_x509_sequence *cur;
  mbedtls_x509_name *name;
  mbedtls_x509_crt *parent;
  int selfsigned;
  int pathlen;
  int ret;
  size_t cn_len;
  uint32_t *flags_local;
  char *cn_local;
  mbedtls_x509_crt_profile *profile_local;
  mbedtls_x509_crl *ca_crl_local;
  mbedtls_x509_crt *trust_ca_local;
  mbedtls_x509_crt *crt_local;
  
  if (profile == (mbedtls_x509_crt_profile *)0x0) {
    crt_local._4_4_ = -0x2800;
  }
  else {
    *flags = 0;
    if (cn != (char *)0x0) {
      cur = (mbedtls_x509_sequence *)&crt->subject;
      len = strlen(cn);
      if ((crt->ext_types & 0x20U) == 0) {
        for (; cur != (mbedtls_x509_sequence *)0x0; cur = (mbedtls_x509_sequence *)cur[1].buf.p) {
          bVar2 = true;
          if ((cur->buf).len == 3) {
            iVar1 = memcmp("U\x04\x03",(cur->buf).p,(cur->buf).len);
            bVar2 = iVar1 != 0;
          }
          if ((!bVar2) &&
             (((*(size_t *)&cur[1].buf == len &&
               (iVar1 = x509_memcasecmp((void *)cur[1].buf.len,cn,len), iVar1 == 0)) ||
              ((2 < *(ulong *)&cur[1].buf &&
               ((*(short *)cur[1].buf.len == 0x2e2a &&
                (iVar1 = x509_check_wildcard(cn,(mbedtls_x509_buf *)&cur->next), iVar1 == 0))))))))
          break;
        }
        if (cur == (mbedtls_x509_sequence *)0x0) {
          *flags = *flags | 4;
        }
      }
      else {
        pmStack_78 = &(crt->subject_alt_names).buf;
        while (((pmStack_78 != (mbedtls_x509_buf *)0x0 &&
                ((pmStack_78->len != len ||
                 (iVar1 = x509_memcasecmp(cn,pmStack_78->p,len), iVar1 != 0)))) &&
               ((pmStack_78->len < 3 ||
                ((*(short *)pmStack_78->p != 0x2e2a ||
                 (iVar1 = x509_check_wildcard(cn,pmStack_78), iVar1 != 0))))))) {
          pmStack_78 = *(mbedtls_x509_buf **)(pmStack_78 + 1);
        }
        if (pmStack_78 == (mbedtls_x509_buf *)0x0) {
          *flags = *flags | 4;
        }
      }
    }
    pk_alg = mbedtls_pk_get_type(&crt->pk);
    iVar1 = x509_profile_check_pk_alg(profile,pk_alg);
    if (iVar1 != 0) {
      *flags = *flags | 0x8000;
    }
    iVar1 = x509_profile_check_key(profile,pk_alg,&crt->pk);
    name = (mbedtls_x509_name *)trust_ca;
    if (iVar1 != 0) {
      *flags = *flags | 0x10000;
    }
    while ((name != (mbedtls_x509_name *)0x0 &&
           (iVar1 = x509_crt_check_parent(crt,(mbedtls_x509_crt *)name,0,1), iVar1 != 0))) {
      name = (mbedtls_x509_name *)name[8].val.len;
    }
    if (name == (mbedtls_x509_name *)0x0) {
      name = (mbedtls_x509_name *)crt->next;
      while ((name != (mbedtls_x509_name *)0x0 &&
             (iVar1 = x509_crt_check_parent(crt,(mbedtls_x509_crt *)name,0,1), iVar1 != 0))) {
        name = (mbedtls_x509_name *)name[8].val.len;
      }
      if (name == (mbedtls_x509_name *)0x0) {
        crt_local._4_4_ = x509_crt_verify_top(crt,trust_ca,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy);
      }
      else {
        crt_local._4_4_ =
             x509_crt_verify_child
                       (crt,(mbedtls_x509_crt *)name,trust_ca,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy
                       );
      }
    }
    else {
      crt_local._4_4_ =
           x509_crt_verify_top(crt,(mbedtls_x509_crt *)name,ca_crl,profile,0,0,flags,f_vrfy,p_vrfy);
    }
    if (crt_local._4_4_ == 0) {
      if (*flags == 0) {
        crt_local._4_4_ = 0;
      }
      else {
        crt_local._4_4_ = -0x2700;
      }
    }
  }
  return crt_local._4_4_;
}

Assistant:

int mbedtls_x509_crt_verify_with_profile( mbedtls_x509_crt *crt,
                     mbedtls_x509_crt *trust_ca,
                     mbedtls_x509_crl *ca_crl,
                     const mbedtls_x509_crt_profile *profile,
                     const char *cn, uint32_t *flags,
                     int (*f_vrfy)(void *, mbedtls_x509_crt *, int, uint32_t *),
                     void *p_vrfy )
{
    size_t cn_len;
    int ret;
    int pathlen = 0, selfsigned = 0;
    mbedtls_x509_crt *parent;
    mbedtls_x509_name *name;
    mbedtls_x509_sequence *cur = NULL;
    mbedtls_pk_type_t pk_type;

    if( profile == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    *flags = 0;

    if( cn != NULL )
    {
        name = &crt->subject;
        cn_len = strlen( cn );

        if( crt->ext_types & MBEDTLS_X509_EXT_SUBJECT_ALT_NAME )
        {
            cur = &crt->subject_alt_names;

            while( cur != NULL )
            {
                if( cur->buf.len == cn_len &&
                    x509_memcasecmp( cn, cur->buf.p, cn_len ) == 0 )
                    break;

                if( cur->buf.len > 2 &&
                    memcmp( cur->buf.p, "*.", 2 ) == 0 &&
                    x509_check_wildcard( cn, &cur->buf ) == 0 )
                {
                    break;
                }

                cur = cur->next;
            }

            if( cur == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
        else
        {
            while( name != NULL )
            {
                if( MBEDTLS_OID_CMP( MBEDTLS_OID_AT_CN, &name->oid ) == 0 )
                {
                    if( name->val.len == cn_len &&
                        x509_memcasecmp( name->val.p, cn, cn_len ) == 0 )
                        break;

                    if( name->val.len > 2 &&
                        memcmp( name->val.p, "*.", 2 ) == 0 &&
                        x509_check_wildcard( cn, &name->val ) == 0 )
                        break;
                }

                name = name->next;
            }

            if( name == NULL )
                *flags |= MBEDTLS_X509_BADCERT_CN_MISMATCH;
        }
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type( &crt->pk );

    if( x509_profile_check_pk_alg( profile, pk_type ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_PK;

    if( x509_profile_check_key( profile, pk_type, &crt->pk ) != 0 )
        *flags |= MBEDTLS_X509_BADCERT_BAD_KEY;

    /* Look for a parent in trusted CAs */
    for( parent = trust_ca; parent != NULL; parent = parent->next )
    {
        if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
            break;
    }

    if( parent != NULL )
    {
        ret = x509_crt_verify_top( crt, parent, ca_crl, profile,
                                   pathlen, selfsigned, flags, f_vrfy, p_vrfy );
        if( ret != 0 )
            return( ret );
    }
    else
    {
        /* Look for a parent upwards the chain */
        for( parent = crt->next; parent != NULL; parent = parent->next )
            if( x509_crt_check_parent( crt, parent, 0, pathlen == 0 ) == 0 )
                break;

        /* Are we part of the chain or at the top? */
        if( parent != NULL )
        {
            ret = x509_crt_verify_child( crt, parent, trust_ca, ca_crl, profile,
                                         pathlen, selfsigned, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
        else
        {
            ret = x509_crt_verify_top( crt, trust_ca, ca_crl, profile,
                                       pathlen, selfsigned, flags, f_vrfy, p_vrfy );
            if( ret != 0 )
                return( ret );
        }
    }

    if( *flags != 0 )
        return( MBEDTLS_ERR_X509_CERT_VERIFY_FAILED );

    return( 0 );
}